

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O3

int archive_write_set_format_v7tar(archive *_a)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_v7tar");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if ((code *)_a[2].archive_format_name != (code *)0x0) {
      (*(code *)_a[2].archive_format_name)(_a);
    }
    pvVar2 = calloc(1,0x28);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate v7tar data");
    }
    else {
      _a[1].read_data_offset = (int64_t)pvVar2;
      _a[1].read_data_output_offset = (int64_t)"tar (non-POSIX)";
      *(code **)&_a[1].read_data_is_posix_read = archive_write_v7tar_options;
      *(code **)(_a + 2) = archive_write_v7tar_header;
      _a[2].vtable = (archive_vtable_conflict *)archive_write_v7tar_data;
      *(code **)&_a[2].archive_format = archive_write_v7tar_close;
      _a[2].archive_format_name = (char *)archive_write_v7tar_free;
      _a[1].read_data_requested = (size_t)archive_write_v7tar_finish_entry;
      _a->archive_format = 0x30000;
      _a->archive_format_name = "tar (non-POSIX)";
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_set_format_v7tar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct v7tar *v7tar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_v7tar");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	/* Basic internal sanity test. */
	if (sizeof(template_header) != 512) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal: template_header wrong size: %zu should be 512",
		    sizeof(template_header));
		return (ARCHIVE_FATAL);
	}

	v7tar = (struct v7tar *)calloc(1, sizeof(*v7tar));
	if (v7tar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = v7tar;
	a->format_name = "tar (non-POSIX)";
	a->format_options = archive_write_v7tar_options;
	a->format_write_header = archive_write_v7tar_header;
	a->format_write_data = archive_write_v7tar_data;
	a->format_close = archive_write_v7tar_close;
	a->format_free = archive_write_v7tar_free;
	a->format_finish_entry = archive_write_v7tar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_TAR;
	a->archive.archive_format_name = "tar (non-POSIX)";
	return (ARCHIVE_OK);
}